

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O2

Matrix<double,__1,__1> __thiscall Matrix<double,_-1,_-1>::transpose(Matrix<double,__1,__1> *this)

{
  Matrix<double,__1,__1> MVar1;
  double *pdVar2;
  int i;
  int col;
  int j;
  int row;
  Matrix<double,__1,__1> result;
  Matrix<double,__1,__1> local_30;
  
  local_30.data = (double *)0x0;
  local_30.rows = -1;
  local_30.cols = -1;
  resize(&local_30,this->cols,this->rows);
  for (col = 0; col < local_30.rows; col = col + 1) {
    for (row = 0; row < local_30.cols; row = row + 1) {
      pdVar2 = operator()(this,row,col);
      SetElement(&local_30,col,row,*pdVar2);
    }
  }
  MVar1.cols = local_30.cols;
  MVar1.rows = local_30.rows;
  MVar1.data = local_30.data;
  return MVar1;
}

Assistant:

Matrix<Type, _1, _0> Matrix<Type, _0, _1>::transpose()
{
    Matrix<Type, _1, _0> result;
    if(_1 == Dynamic || _0 == Dynamic)
        result.resize(this->cols, this->rows);
    for(int i = 0; i < result.row(); ++i)
    {
        for(int j = 0; j < result.col(); ++j)
        {
            Type num = this->operator()(j, i);
            result.SetElement(i, j, num);
        }
    }
    return result;
}